

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Covariance4D.hpp
# Opt level: O3

void __thiscall
Covariance::Covariance4D<Vector,_double>::Projection(Covariance4D<Vector,_double> *this,Vector *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  dVar2 = (this->x).z * n->z + (this->x).x * n->x + (this->x).y * n->y;
  dVar11 = 0.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar11 = atan2(dVar2,n->z * (this->y).z + n->x * (this->y).x + n->y * (this->y).y);
  }
  dVar3 = cos(dVar11);
  dVar4 = sin(dVar11);
  dVar10 = -dVar4 * dVar3;
  dVar12 = dVar3 * dVar3;
  dVar13 = dVar4 * dVar4;
  dVar2 = (this->matrix)._M_elems[2];
  dVar11 = (this->matrix)._M_elems[5];
  dVar1 = (this->matrix)._M_elems[8];
  dVar7 = (this->matrix)._M_elems[9];
  dVar15 = (dVar10 + dVar10) * dVar1;
  (this->matrix)._M_elems[9] = dVar11 * dVar13 + (dVar12 * dVar7 - dVar15);
  dVar14 = (this->matrix)._M_elems[3];
  dVar9 = (this->matrix)._M_elems[4];
  dVar5 = (this->matrix)._M_elems[6];
  dVar6 = (this->matrix)._M_elems[7];
  dVar16 = dVar10 * (dVar5 + dVar9);
  dVar17 = dVar10 * (dVar6 - dVar14);
  dVar8 = dVar5 * -dVar13 + dVar12 * dVar9 + dVar17;
  (this->matrix)._M_elems[3] = dVar6 * dVar13 + dVar12 * dVar14 + dVar16;
  (this->matrix)._M_elems[4] = dVar8;
  dVar5 = (this->matrix)._M_elems[6];
  (this->matrix)._M_elems[5] = dVar7 * dVar13 + (this->matrix)._M_elems[5] * dVar12 + dVar15;
  (this->matrix)._M_elems[6] = dVar9 * -dVar13 + dVar5 * dVar12 + dVar17;
  dVar6 = dVar14 * dVar13 + (dVar6 * dVar12 - dVar16);
  (this->matrix)._M_elems[7] = dVar6;
  (this->matrix)._M_elems[8] = dVar1 * (dVar12 - dVar13) + (dVar7 - dVar11) * dVar10;
  dVar11 = (this->z).x;
  dVar14 = (this->matrix)._M_elems[0];
  dVar9 = (this->matrix)._M_elems[1];
  dVar5 = dVar9 * (dVar10 + dVar10);
  dVar1 = (this->z).y;
  dVar7 = (this->z).z;
  (this->matrix)._M_elems[0] = dVar13 * dVar2 + dVar12 * dVar14 + dVar5;
  dVar15 = dVar13 * dVar14 + (dVar12 * dVar2 - dVar5);
  dVar14 = (dVar12 - dVar13) * dVar9 + (dVar2 - dVar14) * dVar10;
  (this->matrix)._M_elems[1] = dVar14;
  (this->matrix)._M_elems[2] = dVar15;
  dVar5 = dVar7 * n->z + dVar11 * n->x + dVar1 * n->y;
  dVar2 = ABS(dVar5);
  (this->matrix)._M_elems[1] = dVar2 * dVar14;
  (this->matrix)._M_elems[2] = dVar5 * dVar5 * dVar15;
  (this->matrix)._M_elems[4] = dVar8 * dVar2;
  (this->matrix)._M_elems[7] = dVar2 * dVar6;
  dVar7 = (this->x).x * dVar3 - (this->y).x * dVar4;
  dVar14 = (this->x).y * dVar3 - dVar4 * (this->y).y;
  dVar9 = (this->x).z * dVar3 - dVar4 * (this->y).z;
  (this->x).x = dVar7;
  (this->x).y = dVar14;
  (this->x).z = dVar9;
  dVar11 = n->x;
  dVar1 = n->y;
  dVar2 = n->z;
  if (0.0 <= dVar5) {
    dVar5 = dVar9 * dVar1 - dVar2 * dVar14;
    dVar9 = dVar7 * dVar2 - dVar11 * dVar9;
    dVar7 = dVar11 * dVar14 - dVar1 * dVar7;
  }
  else {
    dVar5 = dVar2 * dVar14 - dVar1 * dVar9;
    dVar9 = dVar11 * dVar9 - dVar2 * dVar7;
    dVar7 = dVar1 * dVar7 - dVar14 * dVar11;
  }
  (this->z).x = dVar11;
  (this->z).y = dVar1;
  (this->z).z = dVar2;
  (this->y).x = dVar5;
  (this->y).y = dVar9;
  (this->y).z = dVar7;
  return;
}

Assistant:

inline void Projection(const Vector& n) {

         const auto cx = Vector::Dot(x, n);
         const auto cy = Vector::Dot(y, n);

         // Rotate the Frame to be aligned with plane.
         const Float alpha = (cx != 0.0) ? atan2(cx, cy) : 0.0;
         const Float c = cos(alpha), s = -sin(alpha);
         Rotate(c, s);

         // Scale the componnent that project by the cosine of the ray direction
         // and the normal.
         const Float cosine = Vector::Dot(z, n);
         ScaleY(std::abs(cosine));

         // Update direction vectors.
         x = c*x + s*y;
         z = (cosine < 0.0f) ? -n : n;
         y = (cosine < 0.0f) ?  Vector::Cross(x, z) : Vector::Cross(z, x);
      }